

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

int secp256k1_musig_pubnonce_parse
              (secp256k1_context *ctx,secp256k1_musig_pubnonce *nonce,uchar *in66)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  char *pcVar4;
  secp256k1_ge ges [2];
  
  if (nonce == (secp256k1_musig_pubnonce *)0x0) {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "nonce != NULL";
  }
  else {
    if (in66 != (uchar *)0x0) {
      lVar2 = 0;
      do {
        if (lVar2 + 0x58 == 0x108) {
          secp256k1_musig_pubnonce_save(nonce,ges);
          return 1;
        }
        iVar1 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)((long)ges[0].x.n + lVar2),in66,0x21);
        lVar2 = lVar2 + 0x58;
        in66 = in66 + 0x21;
      } while (iVar1 != 0);
      return 0;
    }
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "in66 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar4,pvVar3);
  return 0;
}

Assistant:

int secp256k1_musig_pubnonce_parse(const secp256k1_context* ctx, secp256k1_musig_pubnonce* nonce, const unsigned char *in66) {
    secp256k1_ge ges[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(in66 != NULL);

    for (i = 0; i < 2; i++) {
        if (!secp256k1_eckey_pubkey_parse(&ges[i], &in66[33*i], 33)) {
            return 0;
        }
        if (!secp256k1_ge_is_in_correct_subgroup(&ges[i])) {
            return 0;
        }
    }
    secp256k1_musig_pubnonce_save(nonce, ges);
    return 1;
}